

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void QAnimationTimer::registerAnimation(QAbstractAnimation *animation,bool isTopLevel)

{
  QAnimationTimer *obj;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QAbstractAnimation *local_48;
  char *pcStack_40;
  QMetaTypeInterface *local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  obj = instance(true);
  registerRunningAnimation((QAnimationTimer *)obj,animation);
  if ((int)CONCAT71(in_register_00000031,isTopLevel) != 0) {
    *(undefined1 *)((long)&(animation->super_QObject).d_ptr.d[1].bindingStorage.d + 1) = 1;
    local_48 = animation;
    QtPrivate::QPodArrayOps<QAbstractAnimation*>::emplace<QAbstractAnimation*&>
              ((QPodArrayOps<QAbstractAnimation*> *)&obj->animationsToStart,
               (obj->animationsToStart).d.size,&local_48);
    QList<QAbstractAnimation_*>::end(&obj->animationsToStart);
    if (obj->startAnimationPending == false) {
      obj->startAnimationPending = true;
      local_48 = (QAbstractAnimation *)0x0;
      pcStack_40 = (char *)0x0;
      local_38[0] = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                ((QObject *)obj,"startAnimations",QueuedConnection,1,&local_48,&pcStack_40,local_38)
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAnimationTimer::registerAnimation(QAbstractAnimation *animation, bool isTopLevel)
{
    QAnimationTimer *inst = instance(true); //we create the instance if needed
    inst->registerRunningAnimation(animation);
    if (isTopLevel) {
        Q_ASSERT(!QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer);
        QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer = true;
        inst->animationsToStart << animation;
        if (!inst->startAnimationPending) {
            inst->startAnimationPending = true;
            QMetaObject::invokeMethod(inst, "startAnimations", Qt::QueuedConnection);
        }
    }
}